

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlFAGenerateEpsilonTransition(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr from,xmlRegStatePtr to)

{
  int extraout_EAX;
  
  if (to == (xmlRegStatePtr)0x0) {
    to = xmlRegStatePush(ctxt);
    if (to == (xmlRegStatePtr)0x0) {
      return 0;
    }
    ctxt->state = to;
  }
  xmlRegStateAddTrans(ctxt,from,(xmlRegAtomPtr)0x0,to,-1,-1);
  return extraout_EAX;
}

Assistant:

static int
xmlFAGenerateEpsilonTransition(xmlRegParserCtxtPtr ctxt,
			       xmlRegStatePtr from, xmlRegStatePtr to) {
    if (to == NULL) {
	to = xmlRegStatePush(ctxt);
        if (to == NULL)
            return(-1);
	ctxt->state = to;
    }
    xmlRegStateAddTrans(ctxt, from, NULL, to, -1, -1);
    return(0);
}